

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomUniformDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformdynamic(NeuralNetworkLayer *this)

{
  RandomUniformDynamicLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x4b0) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4b0;
    this_00 = (RandomUniformDynamicLayerParams *)operator_new(0x28);
    RandomUniformDynamicLayerParams::RandomUniformDynamicLayerParams(this_00);
    (this->layer_).randomuniformdynamic_ = this_00;
  }
  return (RandomUniformDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomUniformDynamicLayerParams* NeuralNetworkLayer::mutable_randomuniformdynamic() {
  if (!has_randomuniformdynamic()) {
    clear_layer();
    set_has_randomuniformdynamic();
    layer_.randomuniformdynamic_ = new ::CoreML::Specification::RandomUniformDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomUniformDynamic)
  return layer_.randomuniformdynamic_;
}